

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.h
# Opt level: O2

void idx2::Reverse<signed_char*>(char *Beg,char *End)

{
  char cVar1;
  
  for (; End = End + -1, Beg < End; Beg = Beg + 1) {
    cVar1 = *Beg;
    *Beg = *End;
    *End = cVar1;
  }
  return;
}

Assistant:

void
Reverse(i Beg, i End)
{
  auto It1 = Beg;
  auto It2 = End - 1;
  while (It1 < It2)
  {
    Swap(It1, It2);
    ++It1;
    --It2;
  }
}